

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)57,_(unsigned_short)19>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar3 = *in;
  uVar1 = puVar3[2];
  out[0x13] = (ulong)(uVar1 & 0xfffff) << 0x25 | (ulong)puVar3[1] << 5 | (ulong)(*puVar3 >> 0x1b);
  uVar2 = puVar3[3];
  *in = puVar3 + 4;
  out[0x14] = (ulong)(puVar3[4] & 0x1fff) << 0x2c | (ulong)uVar2 << 0xc | (ulong)(uVar1 >> 0x14);
  Unroller<(unsigned_short)57,_(unsigned_short)21>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}